

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall FlowGraph::FindLoops(FlowGraph *this)

{
  Func **ppFVar1;
  IRKind IVar2;
  BasicBlock *headBlock;
  Instr *pIVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *ppFVar7;
  BasicBlock *tailBlock;
  undefined1 local_40 [8];
  Iterator __iter;
  
  if ((this->hasLoop == true) &&
     (tailBlock = this->func->m_fg->tailBlock, tailBlock != (BasicBlock *)0x0)) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (((tailBlock->field_0x18 & 1) == 0) && (tailBlock->loop == (Loop *)0x0)) {
        local_40 = (undefined1  [8])&tailBlock->succList;
        __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
        while( true ) {
          if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) goto LAB_0041837d;
            *puVar6 = 0;
          }
          __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                        ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if ((undefined1  [8])__iter.list == local_40) break;
          ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                              ((Iterator *)local_40);
          headBlock = (*ppFVar7)->succBlock;
          if (headBlock == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x4dd,"(succ)","succ");
            if (!bVar5) goto LAB_0041837d;
            *puVar6 = 0;
          }
          if (((headBlock->field_0x18 & 4) != 0) && (headBlock->loop == (Loop *)0x0)) {
            BuildLoop(this,headBlock,tailBlock,(Loop *)0x0);
          }
        }
        if (((*(ushort *)&tailBlock->field_0x18 & 4) != 0) && (tailBlock->loop == (Loop *)0x0)) {
          *(ushort *)&tailBlock->field_0x18 = *(ushort *)&tailBlock->field_0x18 & 0xfffb;
          pIVar3 = tailBlock->firstInstr;
          IVar2 = pIVar3->m_kind;
          if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
            AssertCount = AssertCount + 1;
            __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar5) {
LAB_0041837d:
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar6 = 0;
          }
          ppFVar1 = &pIVar3[1].m_func;
          *(byte *)ppFVar1 = *(byte *)ppFVar1 & 0xfe;
        }
      }
      tailBlock = tailBlock->prev;
    } while (tailBlock != (BasicBlock *)0x0);
  }
  return;
}

Assistant:

void
FlowGraph::FindLoops()
{
    if (!this->hasLoop)
    {
        return;
    }

    Func * func = this->func;

    FOREACH_BLOCK_BACKWARD_IN_FUNC(block, func)
    {
        if (block->loop != nullptr)
        {
            // Block already visited
            continue;
        }
        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (succ->isLoopHeader && succ->loop == nullptr)
            {
                // Found a loop back-edge
                BuildLoop(succ, block);
            }
        } NEXT_SUCCESSOR_BLOCK;
        if (block->isLoopHeader && block->loop == nullptr)
        {
            // We would have built a loop for it if it was a loop...
            block->isLoopHeader = false;
            block->GetFirstInstr()->AsLabelInstr()->m_isLoopTop = false;
        }
    } NEXT_BLOCK_BACKWARD_IN_FUNC;
}